

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O0

Result * __thiscall
CoreML::
validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
          (Result *__return_storage_ptr__,CoreML *this,
          RepeatedPtrField<CoreML::Specification::FeatureDescription> *features)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  int iVar1;
  bool bVar2;
  int iVar3;
  FeatureDescription *featureDesc;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_8d;
  TypeCase local_8c [3];
  iterator local_80;
  size_type local_78;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_70;
  Result local_58;
  int local_20;
  undefined1 local_19;
  int i;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features_local;
  Result *result;
  
  local_19 = 0;
  _i = this;
  features_local =
       (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)__return_storage_ptr__;
  Result::Result(__return_storage_ptr__);
  local_20 = 0;
  while( true ) {
    iVar1 = local_20;
    iVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                      ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)_i);
    if (iVar3 <= iVar1) {
      return __return_storage_ptr__;
    }
    local_8c[0] = kDoubleType;
    local_8c[1] = 1;
    local_8c[2] = 5;
    local_80 = local_8c;
    local_78 = 3;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_8d);
    __l._M_len = local_78;
    __l._M_array = local_80;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_70,__l,&local_8d);
    featureDesc = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                  operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)_i,
                             local_20);
    validateSchemaTypes(&local_58,&local_70,featureDesc);
    Result::operator=(__return_storage_ptr__,&local_58);
    Result::~Result(&local_58);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_70);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_8d);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) break;
    local_20 = local_20 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateDescriptionsAreAllVectorizableTypes(const Descriptions &features) {
        Result result;
        for (int i = 0; i < features.size(); i++) {
            result = validateSchemaTypes({
                Specification::FeatureType::kDoubleType,
                Specification::FeatureType::kInt64Type,
                Specification::FeatureType::kMultiArrayType,
            }, features[i]);
            if (!result.good()) {
                return result;
            }
        }

        return result;
    }